

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

int xmlTextReaderMoveToAttributeNo(xmlTextReaderPtr reader,int no)

{
  xmlNodePtr local_30;
  xmlNsPtr ns;
  xmlAttrPtr cur;
  int i;
  int no_local;
  xmlTextReaderPtr reader_local;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    reader_local._4_4_ = -1;
  }
  else if (reader->node == (xmlNodePtr)0x0) {
    reader_local._4_4_ = -1;
  }
  else if (reader->node->type == XML_ELEMENT_NODE) {
    reader->curnode = (xmlNodePtr)0x0;
    local_30 = (xmlNodePtr)reader->node->nsDef;
    for (cur._0_4_ = 0; (int)cur < no && local_30 != (xmlNodePtr)0x0; cur._0_4_ = (int)cur + 1) {
      local_30 = (xmlNodePtr)local_30->_private;
    }
    if (local_30 == (xmlNodePtr)0x0) {
      ns = (xmlNsPtr)reader->node->properties;
      if ((_xmlAttr *)ns == (_xmlAttr *)0x0) {
        reader_local._4_4_ = 0;
      }
      else {
        for (; (int)cur < no; cur._0_4_ = (int)cur + 1) {
          ns = ns[1].next;
          if (ns == (_xmlNs *)0x0) {
            return 0;
          }
        }
        reader->curnode = (xmlNodePtr)ns;
        reader_local._4_4_ = 1;
      }
    }
    else {
      reader->curnode = local_30;
      reader_local._4_4_ = 1;
    }
  }
  else {
    reader_local._4_4_ = -1;
  }
  return reader_local._4_4_;
}

Assistant:

int
xmlTextReaderMoveToAttributeNo(xmlTextReaderPtr reader, int no) {
    int i;
    xmlAttrPtr cur;
    xmlNsPtr ns;

    if (reader == NULL)
	return(-1);
    if (reader->node == NULL)
	return(-1);
    /* TODO: handle the xmlDecl */
    if (reader->node->type != XML_ELEMENT_NODE)
	return(-1);

    reader->curnode = NULL;

    ns = reader->node->nsDef;
    for (i = 0;(i < no) && (ns != NULL);i++) {
	ns = ns->next;
    }
    if (ns != NULL) {
	reader->curnode = (xmlNodePtr) ns;
	return(1);
    }

    cur = reader->node->properties;
    if (cur == NULL)
	return(0);
    for (;i < no;i++) {
	cur = cur->next;
	if (cur == NULL)
	    return(0);
    }
    /* TODO walk the DTD if present */

    reader->curnode = (xmlNodePtr) cur;
    return(1);
}